

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Data>::mapping(IO *IO,Data *DWARF)

{
  int iVar1;
  void *local_28;
  void *oldContext;
  EmptyContext Ctx;
  
  local_28 = yaml::IO::getContext(IO);
  yaml::IO::setContext(IO,DWARF);
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>,llvm::yaml::EmptyContext>
            (IO,"debug_str",&DWARF->DebugStrings,(EmptyContext *)((long)&oldContext + 7));
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::DWARFYAML::Abbrev,std::allocator<llvm::DWARFYAML::Abbrev>>,llvm::yaml::EmptyContext>
            (IO,"debug_abbrev",&DWARF->AbbrevDecls,(EmptyContext *)((long)&oldContext + 7));
  if ((DWARF->ARanges).
      super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (DWARF->ARanges).
      super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b17210;
  }
  else {
LAB_00b17210:
    yaml::IO::
    mapOptionalWithContext<std::vector<llvm::DWARFYAML::ARange,std::allocator<llvm::DWARFYAML::ARange>>,llvm::yaml::EmptyContext>
              (IO,"debug_aranges",&DWARF->ARanges,(EmptyContext *)((long)&oldContext + 7));
  }
  if ((DWARF->PubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->PubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b17244;
  }
  else {
LAB_00b17244:
    yaml::IO::processKey<llvm::DWARFYAML::PubSection,llvm::yaml::EmptyContext>
              (IO,"debug_pubnames",&DWARF->PubNames,false,(EmptyContext *)((long)&oldContext + 7));
  }
  if ((DWARF->PubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->PubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b1727d;
  }
  else {
LAB_00b1727d:
    yaml::IO::processKey<llvm::DWARFYAML::PubSection,llvm::yaml::EmptyContext>
              (IO,"debug_pubtypes",&DWARF->PubTypes,false,(EmptyContext *)((long)&oldContext + 7));
  }
  if ((DWARF->GNUPubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->GNUPubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b172b6;
  }
  else {
LAB_00b172b6:
    yaml::IO::processKey<llvm::DWARFYAML::PubSection,llvm::yaml::EmptyContext>
              (IO,"debug_gnu_pubnames",&DWARF->GNUPubNames,false,
               (EmptyContext *)((long)&oldContext + 7));
  }
  if ((DWARF->GNUPubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->GNUPubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') goto LAB_00b1730b;
  }
  yaml::IO::processKey<llvm::DWARFYAML::PubSection,llvm::yaml::EmptyContext>
            (IO,"debug_gnu_pubtypes",&DWARF->GNUPubTypes,false,
             (EmptyContext *)((long)&oldContext + 7));
LAB_00b1730b:
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::DWARFYAML::Unit,std::allocator<llvm::DWARFYAML::Unit>>,llvm::yaml::EmptyContext>
            (IO,"debug_info",&DWARF->CompileUnits,(EmptyContext *)((long)&oldContext + 7));
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::DWARFYAML::LineTable,std::allocator<llvm::DWARFYAML::LineTable>>,llvm::yaml::EmptyContext>
            (IO,"debug_line",&DWARF->DebugLines,(EmptyContext *)((long)&oldContext + 7));
  yaml::IO::setContext(IO,&local_28);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Data>::mapping(IO &IO, DWARFYAML::Data &DWARF) {
  auto oldContext = IO.getContext();
  IO.setContext(&DWARF);
  IO.mapOptional("debug_str", DWARF.DebugStrings);
  IO.mapOptional("debug_abbrev", DWARF.AbbrevDecls);
  if (!DWARF.ARanges.empty() || !IO.outputting())
    IO.mapOptional("debug_aranges", DWARF.ARanges);
  if (!DWARF.PubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubnames", DWARF.PubNames);
  if (!DWARF.PubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubtypes", DWARF.PubTypes);
  if (!DWARF.GNUPubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubnames", DWARF.GNUPubNames);
  if (!DWARF.GNUPubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubtypes", DWARF.GNUPubTypes);
  IO.mapOptional("debug_info", DWARF.CompileUnits);
  IO.mapOptional("debug_line", DWARF.DebugLines);
  IO.setContext(&oldContext);
}